

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O0

int xmlTextWriterWriteAttributeNS
              (xmlTextWriterPtr writer,xmlChar *prefix,xmlChar *name,xmlChar *namespaceURI,
              xmlChar *content)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int sum;
  int count;
  xmlChar *content_local;
  xmlChar *namespaceURI_local;
  xmlChar *name_local;
  xmlChar *prefix_local;
  xmlTextWriterPtr writer_local;
  
  if (((writer == (xmlTextWriterPtr)0x0) || (name == (xmlChar *)0x0)) || (*name == '\0')) {
    writer_local._4_4_ = -1;
  }
  else {
    iVar1 = xmlTextWriterStartAttributeNS(writer,prefix,name,namespaceURI);
    if (iVar1 < 0) {
      writer_local._4_4_ = -1;
    }
    else {
      iVar2 = xmlTextWriterWriteString(writer,content);
      if (iVar2 < 0) {
        writer_local._4_4_ = -1;
      }
      else {
        iVar3 = xmlTextWriterEndAttribute(writer);
        if (iVar3 < 0) {
          writer_local._4_4_ = -1;
        }
        else {
          writer_local._4_4_ = iVar3 + iVar2 + iVar1;
        }
      }
    }
  }
  return writer_local._4_4_;
}

Assistant:

int
xmlTextWriterWriteAttributeNS(xmlTextWriterPtr writer,
                              const xmlChar * prefix, const xmlChar * name,
                              const xmlChar * namespaceURI,
                              const xmlChar * content)
{
    int count;
    int sum;

    if ((writer == NULL) || (name == NULL) || (*name == '\0'))
        return -1;

    sum = 0;
    count = xmlTextWriterStartAttributeNS(writer, prefix, name, namespaceURI);
    if (count < 0)
        return -1;
    sum += count;
    count = xmlTextWriterWriteString(writer, content);
    if (count < 0)
        return -1;
    sum += count;
    count = xmlTextWriterEndAttribute(writer);
    if (count < 0)
        return -1;
    sum += count;

    return sum;
}